

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstddht.cc
# Opt level: O1

void bdStdPrintNodeId(ostream *out,bdNodeId *a)

{
  int i;
  long lVar1;
  string s;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  lVar1 = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  do {
    bd_sprintf_append(&local_50,"%02x",(ulong)a->data[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void bdStdPrintNodeId(std::ostream &out, const bdNodeId *a) {
	std::string s;
	bdStdPrintNodeId(s, a, true);
	out << s;
}